

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# div.cc
# Opt level: O3

int BN_nnmod_pow2(BIGNUM *r,BIGNUM *a,size_t e)

{
  BN_ULONG *pBVar1;
  int iVar2;
  int iVar3;
  BIGNUM *b;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  size_t words;
  
  iVar2 = BN_mod_pow2(r,a,e);
  iVar3 = 0;
  if (iVar2 != 0) {
    iVar2 = BN_is_zero(r);
    iVar3 = 1;
    if ((iVar2 == 0) && (r->neg != 0)) {
      words = (e - 1 >> 6) + 1;
      iVar2 = bn_wexpand(r,words);
      iVar3 = 0;
      if (iVar2 != 0) {
        lVar4 = words - (long)r->width;
        if (lVar4 != 0) {
          memset(r->d + r->width,0,lVar4 * 8);
        }
        r->neg = 0;
        uVar6 = (uint)words;
        r->width = uVar6;
        if (0 < (int)uVar6) {
          pBVar1 = r->d;
          uVar5 = 0;
          do {
            pBVar1[uVar5] = ~pBVar1[uVar5];
            uVar5 = uVar5 + 1;
          } while ((uVar6 & 0x7fffffff) != uVar5);
        }
        if ((e & 0x3f) != 0) {
          r->d[(long)(int)uVar6 + -1] = r->d[(long)(int)uVar6 + -1] & ~(-1L << (sbyte)(e & 0x3f));
        }
        bn_set_minimal_width(r);
        b = BN_value_one();
        iVar2 = BN_add((BIGNUM *)r,(BIGNUM *)r,b);
        return iVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int BN_nnmod_pow2(BIGNUM *r, const BIGNUM *a, size_t e) {
  if (!BN_mod_pow2(r, a, e)) {
    return 0;
  }

  // If the returned value was non-negative, we're done.
  if (BN_is_zero(r) || !r->neg) {
    return 1;
  }

  size_t num_words = 1 + (e - 1) / BN_BITS2;

  // Expand |r| to the size of our modulus.
  if (!bn_wexpand(r, num_words)) {
    return 0;
  }

  // Clear the upper words of |r|.
  OPENSSL_memset(&r->d[r->width], 0, (num_words - r->width) * BN_BYTES);

  // Set parameters of |r|.
  r->neg = 0;
  r->width = (int)num_words;

  // Now, invert every word. The idea here is that we want to compute 2^e-|x|,
  // which is actually equivalent to the twos-complement representation of |x|
  // in |e| bits, which is -x = ~x + 1.
  for (int i = 0; i < r->width; i++) {
    r->d[i] = ~r->d[i];
  }

  // If our exponent doesn't span the top word, we have to mask the rest.
  size_t top_word_exponent = e % BN_BITS2;
  if (top_word_exponent != 0) {
    r->d[r->width - 1] &= (((BN_ULONG)1) << top_word_exponent) - 1;
  }

  // Keep the minimal-width invariant for |BIGNUM|.
  bn_set_minimal_width(r);

  // Finally, add one, for the reason described above.
  return BN_add(r, r, BN_value_one());
}